

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util_test.cc
# Opt level: O2

void __thiscall StringPieceUtilTestJoinStringPiece::Run(StringPieceUtilTestJoinStringPiece *this)

{
  StringPiece input_00;
  StringPiece input_01;
  StringPiece input_02;
  Test *pTVar1;
  bool bVar2;
  StringPiece input_03;
  vector<StringPiece,_std::allocator<StringPiece>_> empty_list;
  vector<StringPiece,_std::allocator<StringPiece>_> list;
  string input;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"a:b:c",(allocator<char> *)&empty_list);
  input_00.len_ = input._M_string_length;
  input_00.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_00,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==("a:b:c",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x50,"\"a:b:c\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,'/');
  bVar2 = std::operator==("a/b/c",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x51,"\"a/b/c\" == JoinStringPiece(list, \'/\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  input_03.len_ = 0;
  input_03.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_03,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x58,"\"\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  pTVar1 = g_current_test;
  empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  JoinStringPiece_abi_cxx11_(&input,&empty_list,':');
  bVar2 = std::operator==("",&input);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x5e,"\"\" == JoinStringPiece(empty_list, \':\')");
  std::__cxx11::string::~string((string *)&input);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&empty_list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"a",(allocator<char> *)&empty_list);
  input_01.len_ = input._M_string_length;
  input_01.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_01,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==("a",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x65,"\"a\" == JoinStringPiece(single_list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,":a:b:c:",(allocator<char> *)&empty_list);
  input_02.len_ = input._M_string_length;
  input_02.str_ = input._M_dataplus._M_p;
  SplitStringPiece(&list,input_02,':');
  pTVar1 = g_current_test;
  JoinStringPiece_abi_cxx11_((string *)&empty_list,&list,':');
  bVar2 = std::operator==(":a:b:c:",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &empty_list);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/string_piece_util_test.cc"
             ,0x6c,"\":a:b:c:\" == JoinStringPiece(list, \':\')");
  std::__cxx11::string::~string((string *)&empty_list);
  std::_Vector_base<StringPiece,_std::allocator<StringPiece>_>::~_Vector_base
            (&list.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>);
  std::__cxx11::string::~string((string *)&input);
  return;
}

Assistant:

TEST(StringPieceUtilTest, JoinStringPiece) {
  {
    string input("a:b:c");
    vector<StringPiece> list = SplitStringPiece(input, ':');

    EXPECT_EQ("a:b:c", JoinStringPiece(list, ':'));
    EXPECT_EQ("a/b/c", JoinStringPiece(list, '/'));
  }

  {
    string empty;
    vector<StringPiece> list = SplitStringPiece(empty, ':');

    EXPECT_EQ("", JoinStringPiece(list, ':'));
  }

  {
    vector<StringPiece> empty_list;

    EXPECT_EQ("", JoinStringPiece(empty_list, ':'));
  }

  {
    string one("a");
    vector<StringPiece> single_list = SplitStringPiece(one, ':');

    EXPECT_EQ("a", JoinStringPiece(single_list, ':'));
  }

  {
    string sep(":a:b:c:");
    vector<StringPiece> list = SplitStringPiece(sep, ':');

    EXPECT_EQ(":a:b:c:", JoinStringPiece(list, ':'));
  }
}